

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Test.h
# Opt level: O0

pair<unsigned_long,_std::tuple<int>_>
cppqc::detail::
doShrink<int,cppqc::detail::null_type,cppqc::detail::null_type,cppqc::detail::null_type,cppqc::detail::null_type>
          (Property<int,_cppqc::detail::null_type,_cppqc::detail::null_type,_cppqc::detail::null_type,_cppqc::detail::null_type>
           *prop,Input *in,duration<double,_std::ratio<1L,_1L>_> timeout,ostream *out)

{
  bool bVar1;
  ostream *in_RCX;
  undefined4 *in_RDX;
  anon_class_16_2_431eb4e8 *in_RDI;
  undefined8 in_XMM0_Qa;
  pair<unsigned_long,_std::tuple<int>_> pVar2;
  Input input;
  iterator __end0;
  iterator __begin0;
  vector<std::tuple<int>,_std::allocator<std::tuple<int>_>_> *__range3;
  vector<std::tuple<int>,_std::allocator<std::tuple<int>_>_> shrinks;
  anon_class_16_2_431eb4e8 isTimeoutReached;
  time_point start;
  Input shrunk;
  size_t numShrinks;
  vector<std::tuple<int>,_std::allocator<std::tuple<int>_>_> *in_stack_ffffffffffffff48;
  undefined6 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff56;
  undefined1 in_stack_ffffffffffffff57;
  anon_class_16_2_431eb4e8 *this;
  __normal_iterator<std::tuple<int>_*,_std::vector<std::tuple<int>,_std::allocator<std::tuple<int>_>_>_>
  local_88;
  undefined1 *local_80;
  undefined1 local_68 [24];
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined4 local_34;
  long local_30;
  ostream *local_28;
  undefined8 local_10;
  
  local_30 = 0;
  local_34 = *in_RDX;
  this = in_RDI;
  local_28 = in_RCX;
  local_10 = in_XMM0_Qa;
  local_50 = std::chrono::_V2::steady_clock::now();
  local_48 = local_10;
  local_40 = local_50;
  do {
    Property<int,_cppqc::detail::null_type,_cppqc::detail::null_type,_cppqc::detail::null_type,_cppqc::detail::null_type>
    ::shrinkInput((Property<int,_cppqc::detail::null_type,_cppqc::detail::null_type,_cppqc::detail::null_type,_cppqc::detail::null_type>
                   *)in_RDI,
                  (Input *)CONCAT17(in_stack_ffffffffffffff57,
                                    CONCAT16(in_stack_ffffffffffffff56,in_stack_ffffffffffffff50)));
    local_80 = local_68;
    local_88._M_current =
         (tuple<int> *)
         std::vector<std::tuple<int>,_std::allocator<std::tuple<int>_>_>::begin
                   (in_stack_ffffffffffffff48);
    std::vector<std::tuple<int>,_std::allocator<std::tuple<int>_>_>::end(in_stack_ffffffffffffff48);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<std::tuple<int>_*,_std::vector<std::tuple<int>,_std::allocator<std::tuple<int>_>_>_>
                               *)CONCAT17(in_stack_ffffffffffffff57,
                                          CONCAT16(in_stack_ffffffffffffff56,
                                                   in_stack_ffffffffffffff50)),
                              (__normal_iterator<std::tuple<int>_*,_std::vector<std::tuple<int>,_std::allocator<std::tuple<int>_>_>_>
                               *)in_stack_ffffffffffffff48), bVar1) {
      __gnu_cxx::
      __normal_iterator<std::tuple<int>_*,_std::vector<std::tuple<int>,_std::allocator<std::tuple<int>_>_>_>
      ::operator*(&local_88);
      in_stack_ffffffffffffff57 =
           doShrink<int,_cppqc::detail::null_type,_cppqc::detail::null_type,_cppqc::detail::null_type,_cppqc::detail::null_type>
           ::anon_class_16_2_431eb4e8::operator()(this);
      if ((bool)in_stack_ffffffffffffff57) {
        std::operator<<(local_28,"Shrinking timed out...\n");
        break;
      }
      in_stack_ffffffffffffff56 =
           Property<int,_cppqc::detail::null_type,_cppqc::detail::null_type,_cppqc::detail::null_type,_cppqc::detail::null_type>
           ::checkInput((Property<int,_cppqc::detail::null_type,_cppqc::detail::null_type,_cppqc::detail::null_type,_cppqc::detail::null_type>
                         *)CONCAT17(in_stack_ffffffffffffff57,
                                    CONCAT16(in_stack_ffffffffffffff56,in_stack_ffffffffffffff50)),
                        (Input *)in_stack_ffffffffffffff48);
      if (!(bool)in_stack_ffffffffffffff56) {
        std::tuple<int>::operator=
                  ((tuple<int> *)
                   CONCAT17(in_stack_ffffffffffffff57,
                            CONCAT16(in_stack_ffffffffffffff56,in_stack_ffffffffffffff50)),
                   (type)in_stack_ffffffffffffff48);
        local_30 = local_30 + 1;
        bVar1 = true;
        goto LAB_00119d55;
      }
      __gnu_cxx::
      __normal_iterator<std::tuple<int>_*,_std::vector<std::tuple<int>,_std::allocator<std::tuple<int>_>_>_>
      ::operator++(&local_88);
    }
    bVar1 = false;
LAB_00119d55:
    std::vector<std::tuple<int>,_std::allocator<std::tuple<int>_>_>::~vector
              ((vector<std::tuple<int>,_std::allocator<std::tuple<int>_>_> *)this);
    if (!bVar1) {
      pVar2 = std::make_pair<unsigned_long&,std::tuple<int>&>
                        ((unsigned_long *)in_RDI,
                         (tuple<int> *)
                         CONCAT17(in_stack_ffffffffffffff57,
                                  CONCAT16(in_stack_ffffffffffffff56,in_stack_ffffffffffffff50)));
      pVar2.first = (unsigned_long)this;
      return pVar2;
    }
  } while( true );
}

Assistant:

std::pair<std::size_t, typename Property<T0, T1, T2, T3, T4>::Input> doShrink(
    const Property<T0, T1, T2, T3, T4>& prop,
    const typename Property<T0, T1, T2, T3, T4>::Input& in,
    std::chrono::duration<double> timeout,
    std::ostream& out = std::cout) {
  using Input = typename Property<T0, T1, T2, T3, T4>::Input;

  std::size_t numShrinks = 0;
  Input shrunk = in;
  const auto start = std::chrono::steady_clock::now();

  auto isTimeoutReached = [start, timeout]() {
    const std::chrono::duration<double> elapsed =
        std::chrono::steady_clock::now() - start;
    return elapsed >= timeout;
  };

  try {
  continueShrinking:
    std::vector<Input> shrinks = prop.shrinkInput(shrunk);
    for (Input input : shrinks) {
      if (isTimeoutReached()) {
        out << "Shrinking timed out...\n";
        break;
      }

      if (!prop.checkInput(input)) {
        shrunk = std::move(input);
        numShrinks++;
        goto continueShrinking;
      }
    }
  } catch (...) {
  }
  return std::make_pair(numShrinks, shrunk);
}